

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVD.hpp
# Opt level: O0

void __thiscall JAMA::SVD<double>::getU(SVD<double> *this,DynamicRectMatrix<double> *A)

{
  double dVar1;
  int *piVar2;
  double *pdVar3;
  DynamicRectMatrix<double> *in_RSI;
  DynamicRectMatrix<double> *in_RDI;
  int j;
  int i;
  int minm;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint j_00;
  uint local_48;
  DynamicRectMatrix<double> *in_stack_ffffffffffffffc0;
  DynamicRectMatrix<double> *in_stack_ffffffffffffffc8;
  int local_18;
  int local_14;
  DynamicRectMatrix<double> *local_10;
  
  local_18 = in_RDI[3].nrow_ + 1;
  local_10 = in_RSI;
  piVar2 = std::min<int>(&local_18,(int *)&in_RDI[3].ncol_);
  local_14 = *piVar2;
  OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
            ((DynamicRectMatrix<double> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (uint)((ulong)&stack0xffffffffffffffc8 >> 0x20),(uint)&stack0xffffffffffffffc8);
  OpenMD::DynamicRectMatrix<double>::operator=(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  OpenMD::DynamicRectMatrix<double>::~DynamicRectMatrix((DynamicRectMatrix<double> *)0x3c6bb3);
  OpenMD::DynamicRectMatrix<double>::~DynamicRectMatrix((DynamicRectMatrix<double> *)0x3c6bbd);
  for (local_48 = 0; (int)local_48 < (int)in_RDI[3].nrow_; local_48 = local_48 + 1) {
    for (j_00 = 0; (int)j_00 < local_14; j_00 = j_00 + 1) {
      pdVar3 = OpenMD::DynamicRectMatrix<double>::operator()(in_RDI,local_48,j_00);
      dVar1 = *pdVar3;
      pdVar3 = OpenMD::DynamicRectMatrix<double>::operator()(local_10,local_48,j_00);
      *pdVar3 = dVar1;
    }
  }
  return;
}

Assistant:

void getU(DynamicRectMatrix<Real>& A) {
      int minm = min(m + 1, n);

      A = DynamicRectMatrix<Real>(m, minm);

      for (int i = 0; i < m; i++)
        for (int j = 0; j < minm; j++)
          A(i, j) = U(i, j);
    }